

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::HandleCommands(CChat *this,float x,float y,float w)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  CCommand *pCVar8;
  ITextRender *pIVar9;
  char *pcVar10;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  char *pArg;
  CCommand *pCommand;
  int j;
  int i_2;
  float h;
  int i_1;
  int i;
  int DisplayCount;
  int ActiveCount;
  float LineHeight;
  float LineWidth;
  float ScrollBarW;
  float Alpha;
  CUIRect HighlightRect;
  CUIRect Rect_1;
  int End;
  CUIRect Rect;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  CChat *in_stack_fffffffffffffed8;
  CChat *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  float fVar11;
  char *local_f0;
  int local_d0;
  int local_cc;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int iVar12;
  undefined4 uVar13;
  float local_b0;
  float local_a0;
  vector4_base<float> local_8c;
  vector4_base<float> local_7c;
  float local_6c;
  float local_68;
  float local_64;
  undefined4 local_60;
  vector4_base<float> local_5c;
  vector4_base<float> local_4c;
  float local_3c;
  float local_38;
  undefined4 local_34;
  float local_30;
  int local_2c;
  vector4_base<float> local_28;
  float local_18;
  float local_14;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RDI + 0x25c44) == 0) ||
     (bVar2 = IsTypingCommand((CChat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                             ), !bVar2)) goto LAB_00153400;
  uVar13 = 0x41000000;
  CLineInput::GetString((CLineInput *)(in_RDI + 0x210));
  FilterChatCommands((CChat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  iVar3 = CCommandManager::CommandCount((CCommandManager *)0x152880);
  iVar3 = iVar3 - *(int *)(in_RDI + 0x363f0);
  iVar4 = minimum<int>(iVar3,0x10);
  if ((iVar4 != 0) &&
     (pbVar7 = array<bool,_allocator_default<bool>_>::operator[]
                         ((array<bool,_allocator_default<bool>_> *)(in_RDI + 0x363e0),
                          *(int *)(in_RDI + 0x363d4)), (*pbVar7 & 1U) != 0)) {
    *(undefined4 *)(in_RDI + 0x363d4) = 0xffffffff;
    NextActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
  }
  if ((iVar4 != 0) &&
     (pbVar7 = array<bool,_allocator_default<bool>_>::operator[]
                         ((array<bool,_allocator_default<bool>_> *)(in_RDI + 0x363e0),
                          *(int *)(in_RDI + 0x363d8)), (*pbVar7 & 1U) != 0)) {
    NextActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
  }
  if (iVar4 < 1) goto LAB_00153400;
  local_14 = -(float)(iVar4 + 1) * 8.0 + in_XMM1_Da;
  local_c = (float)(iVar4 + 1) * 8.0;
  local_18 = in_XMM0_Da;
  vector4_base<float>::vector4_base(&local_28,0.125,0.125,0.125,0.9);
  CUIRect::Draw((CUIRect *)CONCAT44(uVar13,iVar3),(vec4 *)CONCAT44(iVar4,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38);
  local_2c = *(int *)(in_RDI + 0x363d8);
  for (iVar12 = 0; iVar6 = local_2c, iVar12 < iVar4 + -1; iVar12 = iVar12 + 1) {
    NextActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
  }
  iVar5 = CCommandManager::CommandCount((CCommandManager *)0x152a57);
  iVar1 = local_2c;
  if (iVar5 <= iVar6) {
    iVar6 = CCommandManager::CommandCount((CCommandManager *)0x152a7d);
    for (in_stack_ffffffffffffff3c = (float)(iVar1 - iVar6); -1 < (int)in_stack_ffffffffffffff3c;
        in_stack_ffffffffffffff3c = (float)((int)in_stack_ffffffffffffff3c + -1)) {
      PreviousActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
    }
  }
  if (*(int *)(in_RDI + 0x363d4) < *(int *)(in_RDI + 0x363d8)) {
    PreviousActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
  }
  else if (local_2c < *(int *)(in_RDI + 0x363d4)) {
    NextActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
    NextActiveCommand(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8);
  }
  local_b0 = in_XMM2_Da;
  if (iVar4 < iVar3) {
    local_b0 = in_XMM2_Da - 6.0;
    local_3c = in_XMM0_Da + local_b0;
    local_38 = -(float)(iVar4 + 1) * 8.0 + in_XMM1_Da;
    local_34 = 0x40c00000;
    local_30 = (float)(iVar4 + 1) * 8.0;
    vector4_base<float>::vector4_base(&local_4c,0.125,0.125,0.125,0.9);
    CUIRect::Draw((CUIRect *)CONCAT44(uVar13,iVar3),(vec4 *)CONCAT44(iVar4,iVar12),
                  in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38);
    fVar11 = local_30;
    in_stack_ffffffffffffff38 = local_30;
    local_30 = ((float)iVar4 / (float)iVar3) * local_30;
    GetFirstActiveCommand(in_stack_fffffffffffffed8);
    iVar6 = GetActiveCountRange(in_stack_fffffffffffffee0,
                                (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                (int)in_stack_fffffffffffffed8);
    local_38 = (fVar11 * (float)iVar6) / (float)iVar3 + local_38;
    vector4_base<float>::vector4_base(&local_5c,0.5,0.5,0.5,0.9);
    CUIRect::Draw((CUIRect *)CONCAT44(uVar13,iVar3),(vec4 *)CONCAT44(iVar4,iVar12),
                  in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38);
  }
  local_a0 = -(float)(iVar4 + 2) * 8.0 + in_XMM1_Da;
  local_cc = *(int *)(in_RDI + 0x363d8);
  local_d0 = 0;
  while( true ) {
    bVar2 = false;
    if (local_d0 < iVar4) {
      in_stack_fffffffffffffef4 = local_cc;
      iVar6 = CCommandManager::CommandCount((CCommandManager *)0x152d5b);
      bVar2 = in_stack_fffffffffffffef4 < iVar6;
    }
    if (!bVar2) break;
    pbVar7 = array<bool,_allocator_default<bool>_>::operator[]
                       ((array<bool,_allocator_default<bool>_> *)(in_RDI + 0x363e0),local_cc);
    if (((*pbVar7 & 1U) == 0) &&
       (pCVar8 = CCommandManager::GetCommand
                           ((CCommandManager *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4),
       pCVar8 != (CCommand *)0x0)) {
      local_d0 = local_d0 + 1;
      local_a0 = local_a0 + 8.0;
      local_6c = local_18;
      local_64 = local_b0;
      local_60 = 0x40e00000;
      local_68 = local_a0;
      if (pCVar8->m_pfnCallback == ServerCommandCallback) {
        vector4_base<float>::vector4_base(&local_7c,0.0,0.6,0.6,0.2);
        CUIRect::Draw((CUIRect *)CONCAT44(uVar13,iVar3),(vec4 *)CONCAT44(iVar4,iVar12),
                      in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38);
      }
      if (local_cc == *(int *)(in_RDI + 0x363d4)) {
        vector4_base<float>::vector4_base(&local_8c,0.25,0.25,0.6,0.9);
        CUIRect::Draw((CUIRect *)CONCAT44(uVar13,iVar3),(vec4 *)CONCAT44(iVar4,iVar12),
                      in_stack_ffffffffffffff3c,(int)in_stack_ffffffffffffff38);
      }
      if ((HandleCommands(float,float,float)::s_CommandCursor == '\0') &&
         (iVar6 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_CommandCursor),
         iVar6 != 0)) {
        CTextCursor::CTextCursor
                  ((CTextCursor *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8)
        ;
        __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_CommandCursor,&__dso_handle);
        __cxa_guard_release(&HandleCommands(float,float,float)::s_CommandCursor);
      }
      CTextCursor::Reset((CTextCursor *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      CTextCursor::MoveTo((CTextCursor *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      pIVar9 = CComponent::TextRender((CComponent *)0x152f74);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
      pIVar9 = CComponent::TextRender((CComponent *)0x152f98);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&HandleCommands::s_CommandCursor,pCVar8,0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x152fbc);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&HandleCommands::s_CommandCursor," ",0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x152fe2);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
      for (local_f0 = pCVar8->m_aArgsFormat; *local_f0 != '\0'; local_f0 = local_f0 + 1) {
        if (*local_f0 == 'i') {
          pIVar9 = CComponent::TextRender((CComponent *)0x153034);
          (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                    (pIVar9,&HandleCommands::s_CommandCursor,"<number> ",0xffffffff);
        }
        else if (*local_f0 == 'p') {
          pIVar9 = CComponent::TextRender((CComponent *)0x15308f);
          (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                    (pIVar9,&HandleCommands::s_CommandCursor,"<playername> ",0xffffffff);
        }
        else if (*local_f0 == 's') {
          pIVar9 = CComponent::TextRender((CComponent *)0x1530c4);
          (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                    (pIVar9,&HandleCommands::s_CommandCursor,"<text> ",0xffffffff);
        }
        else if (*local_f0 == 'c') {
          pIVar9 = CComponent::TextRender((CComponent *)0x1530f9);
          (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                    (pIVar9,&HandleCommands::s_CommandCursor,"<subcommand> ",0xffffffff);
        }
      }
      pIVar9 = CComponent::TextRender((CComponent *)0x15313a);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
      pIVar9 = CComponent::TextRender((CComponent *)0x153163);
      (*(pIVar9->super_IInterface)._vptr_IInterface[7])
                (pIVar9,&HandleCommands::s_CommandCursor,pCVar8->m_aHelpText,0xffffffff);
      pIVar9 = CComponent::TextRender((CComponent *)0x15318b);
      (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
      pIVar9 = CComponent::TextRender((CComponent *)0x1531af);
      (*(pIVar9->super_IInterface)._vptr_IInterface[0x10])
                (pIVar9,&HandleCommands::s_CommandCursor,0,0xffffffff);
    }
    local_cc = local_cc + 1;
  }
  if ((HandleCommands(float,float,float)::s_NotificationCursor == '\0') &&
     (iVar3 = __cxa_guard_acquire(&HandleCommands(float,float,float)::s_NotificationCursor),
     iVar3 != 0)) {
    CTextCursor::CTextCursor
              ((CTextCursor *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (float)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8);
    __cxa_atexit(CTextCursor::~CTextCursor,&HandleCommands::s_NotificationCursor,&__dso_handle);
    __cxa_guard_release(&HandleCommands(float,float,float)::s_NotificationCursor);
  }
  CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  pIVar9 = CComponent::TextRender((CComponent *)0x153296);
  (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
  if (*(int *)(in_RDI + 0x363d4) < 0) {
LAB_00153372:
    pIVar9 = CComponent::TextRender((CComponent *)0x15337c);
    pcVar10 = Localize((char *)in_stack_fffffffffffffee0,(char *)pIVar9);
    (*(pIVar9->super_IInterface)._vptr_IInterface[7])
              (pIVar9,&HandleCommands::s_NotificationCursor,pcVar10,0xffffffff);
  }
  else {
    CLineInput::GetString((CLineInput *)(in_RDI + 0x210));
    CCommandManager::GetCommand
              ((CCommandManager *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    pcVar10 = str_startswith((char *)in_stack_fffffffffffffed8,
                             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (pcVar10 == (char *)0x0) goto LAB_00153372;
    pIVar9 = CComponent::TextRender((CComponent *)0x15331b);
    pcVar10 = Localize((char *)pIVar9,(char *)in_stack_fffffffffffffed8);
    (*(pIVar9->super_IInterface)._vptr_IInterface[7])
              (pIVar9,&HandleCommands::s_NotificationCursor,pcVar10,0xffffffff);
  }
  pIVar9 = CComponent::TextRender((CComponent *)0x1533b8);
  (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
  pIVar9 = CComponent::TextRender((CComponent *)0x1533dc);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x10])
            (pIVar9,&HandleCommands::s_NotificationCursor,0,0xffffffff);
LAB_00153400:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CChat::HandleCommands(float x, float y, float w)
{
	// render commands menu
	if(m_Mode != CHAT_NONE && IsTypingCommand())
	{
		const float Alpha = 0.90f;
		const float ScrollBarW = 6.0f;
		float LineWidth = w;
		const float LineHeight = 8.0f;

		FilterChatCommands(m_Input.GetString()); // flag active commands, update selected command
		const int ActiveCount = m_CommandManager.CommandCount() - m_FilteredCount;
		const int DisplayCount = minimum(ActiveCount, 16);

		if(DisplayCount && m_aFilter[m_SelectedCommand])
		{
			m_SelectedCommand = -1;
			NextActiveCommand(&m_SelectedCommand);
		}
		if(DisplayCount && m_aFilter[m_CommandStart])
		{
			NextActiveCommand(&m_CommandStart);
		}

		if(DisplayCount > 0) // at least one command to display
		{
			CUIRect Rect = {x, y-(DisplayCount+1)*LineHeight, LineWidth, (DisplayCount+1)*LineHeight};
			Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f);

			int End = m_CommandStart;
			for(int i = 0; i < DisplayCount - 1; i++)
				NextActiveCommand(&End);

			if(End >= m_CommandManager.CommandCount())
				for(int i = End - m_CommandManager.CommandCount(); i >= 0; i--)
					PreviousActiveCommand(&m_CommandStart);

			if(m_SelectedCommand < m_CommandStart)
			{
				PreviousActiveCommand(&m_CommandStart);
			}
			else if(m_SelectedCommand > End)
			{
				NextActiveCommand(&m_CommandStart);
				NextActiveCommand(&End);
			}

			// render worlds most inefficient "scrollbar"
			if(ActiveCount > DisplayCount)
			{
				LineWidth -= ScrollBarW;

				CUIRect Rect = {x + LineWidth, y - (DisplayCount + 1) * LineHeight, ScrollBarW, (DisplayCount+1)*LineHeight};
				Rect.Draw(vec4(0.125f, 0.125f, 0.125f, Alpha), 3.0f, CUIRect::CORNER_R);

				float h = Rect.h;
				Rect.h *= (float)DisplayCount/ActiveCount;
				Rect.y += h * (float)(GetActiveCountRange(GetFirstActiveCommand(), m_CommandStart))/ActiveCount;
				Rect.Draw(vec4(0.5f, 0.5f, 0.5f, Alpha), 3.0f, CUIRect::CORNER_R);
			}

			y -= (DisplayCount+2)*LineHeight;
			for(int i = m_CommandStart, j = 0; j < DisplayCount && i < m_CommandManager.CommandCount(); i++)
			{
				if(m_aFilter[i])
					continue;

				const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(i);
				if(!pCommand)
					continue;

				j++;

				y += LineHeight;
				CUIRect HighlightRect = {Rect.x, y, LineWidth, LineHeight-1};

				if(pCommand->m_pfnCallback == ServerCommandCallback)
					HighlightRect.Draw(vec4(0.0f, 0.6f, 0.6f, 0.2f), 0);

				// draw selection box
				if(i == m_SelectedCommand)
					HighlightRect.Draw(vec4(0.25f, 0.25f, 0.6f, Alpha), 2.0f);

				// print command
				static CTextCursor s_CommandCursor(5.0f);
				s_CommandCursor.Reset();
				s_CommandCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aName, -1);
				TextRender()->TextDeferred(&s_CommandCursor, " ", -1);

				TextRender()->TextColor(0.0f, 0.5f, 0.5f, 1.0f);
				for(const char *pArg = pCommand->m_aArgsFormat; *pArg; pArg++)
				{
					if(*pArg == 'i') // Integer argument
						TextRender()->TextDeferred(&s_CommandCursor, "<number> ", -1);
					else if(*pArg == 'p') // Player name argument
						TextRender()->TextDeferred(&s_CommandCursor, "<playername> ", -1);
					else if(*pArg == 's') // String argument
						TextRender()->TextDeferred(&s_CommandCursor, "<text> ", -1);
					else if(*pArg == 'c') // Subcommand argument
						TextRender()->TextDeferred(&s_CommandCursor, "<subcommand> ", -1);
				}
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				TextRender()->TextDeferred(&s_CommandCursor, pCommand->m_aHelpText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_CommandCursor);
			}

			// render notification
			{
				y += LineHeight;
				static CTextCursor s_NotificationCursor(5.0f);
				s_NotificationCursor.Reset();
				s_NotificationCursor.MoveTo(Rect.x + 5.0f, y);
				TextRender()->TextColor(0.5f, 0.5f, 0.5f, 1.0f);
				if(m_SelectedCommand >= 0 && str_startswith(m_Input.GetString() + 1, m_CommandManager.GetCommand(m_SelectedCommand)->m_aName))
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Enter to confirm or Esc to cancel"), -1);
				else
					TextRender()->TextDeferred(&s_NotificationCursor, Localize("Press Tab to select or Esc to cancel"), -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);
				TextRender()->DrawTextOutlined(&s_NotificationCursor);
			}
		}
	}
}